

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O2

int __thiscall
QTableViewPrivate::nextActiveVisualRow
          (QTableViewPrivate *this,int rowToStart,int column,int limit,
          SearchDirection searchDirection)

{
  bool bVar1;
  int lc;
  int iVar2;
  int vr;
  long in_FS_OFFSET;
  anon_class_8_1_8991fb9c local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lc = logicalColumn(this,column);
  iVar2 = rowToStart;
  local_38.this = this;
  if (searchDirection == Increasing) {
    vr = rowToStart;
    if (rowToStart < limit) {
      do {
        bVar1 = nextActiveVisualRow::anon_class_8_1_8991fb9c::operator()(&local_38,vr,lc);
        iVar2 = vr;
        if (bVar1) break;
        vr = vr + 1;
        iVar2 = rowToStart;
      } while (limit != vr);
    }
  }
  else if (searchDirection == Decreasing) {
    while ((iVar2 = rowToStart, limit < rowToStart &&
           (bVar1 = nextActiveVisualRow::anon_class_8_1_8991fb9c::operator()
                              (&local_38,rowToStart,lc), !bVar1))) {
      rowToStart = rowToStart + -1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return iVar2;
}

Assistant:

int QTableViewPrivate::nextActiveVisualRow(int rowToStart, int column, int limit,
                                           SearchDirection searchDirection) const
{
    const int lc = logicalColumn(column);
    int visualRow = rowToStart;
    const auto isCellActive = [this](int vr, int lc)
    {
        const int lr = logicalRow(vr);
        return !isRowHidden(lr) && isCellEnabled(lr, lc);
    };
    switch (searchDirection) {
    case SearchDirection::Increasing:
        if (visualRow < limit) {
            while (!isCellActive(visualRow, lc)) {
                if (++visualRow == limit)
                    return rowToStart;
            }
        }
        break;
    case SearchDirection::Decreasing:
        while (visualRow > limit && !isCellActive(visualRow, lc))
            --visualRow;
        break;
    }
    return visualRow;
}